

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileGate.cpp
# Opt level: O3

string * __thiscall TileGate::toString_abi_cxx11_(string *__return_storage_ptr__,TileGate *this)

{
  pointer pcVar1;
  pointer pbVar2;
  long lVar3;
  
  pbVar2 = GATE_SYMBOL_TABLE_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(int)this->_state +
          (long)(int)(this->super_Tile)._direction * 3 +
          (long)*(int *)&(this->super_Tile).field_0x24 * 0xc;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = pbVar2[lVar3 + -1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pbVar2[lVar3 + -1]._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

string TileGate::toString() const {
    return GATE_SYMBOL_TABLE[_type * 12 + _direction * 3 + _state - 1];
}